

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_776f::TENSOR_TO_INDEX_Test::TestBody(TENSOR_TO_INDEX_Test *this)

{
  char *pcVar1;
  array<unsigned_int,_3UL> size;
  AssertHelper local_80;
  array<unsigned_int,_3UL> local_78;
  AssertionResult gtest_ar;
  uint local_54;
  tensor<int,_3U> ts;
  
  size._M_elems[2] = 4;
  size._M_elems[0] = 2;
  size._M_elems[1] = 3;
  dnet::data_types::tensor<int,_3U>::tensor(&ts,size);
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 0;
  local_78._M_elems[2] = 2;
  local_80.data_._0_4_ = dnet::data_types::tensor<int,_3U>::to_index(&ts,&local_78);
  local_54 = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ts.to_index({0,0,2})","12*0+4*0+1*2",(int *)&local_80,
             (int *)&local_54);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 1;
  local_78._M_elems[2] = 2;
  local_80.data_._0_4_ = dnet::data_types::tensor<int,_3U>::to_index(&ts,&local_78);
  local_54 = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ts.to_index({0,1,2})","12*0+4*1+1*2",(int *)&local_80,
             (int *)&local_54);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78._M_elems[0] = 1;
  local_78._M_elems[1] = 2;
  local_78._M_elems[2] = 3;
  local_80.data_._0_4_ = dnet::data_types::tensor<int,_3U>::to_index(&ts,&local_78);
  local_54 = 0x17;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ts.to_index({1,2,3})","12*1+4*2+1*3",(int *)&local_80,
             (int *)&local_54);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ts);
  return;
}

Assistant:

TEST(TENSOR, TO_INDEX) {
        tensor<int, 3> ts({2,3,4});
        EXPECT_EQ(ts.to_index({0,0,2}), 12*0+4*0+1*2);
        EXPECT_EQ(ts.to_index({0,1,2}), 12*0+4*1+1*2);
        EXPECT_EQ(ts.to_index({1,2,3}), 12*1+4*2+1*3);
    }